

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::ResizeBilinearLayerParams
          (ResizeBilinearLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ResizeBilinearLayerParams_0040d5c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->targetsize_).current_size_ = 0;
  (this->targetsize_).total_size_ = 0;
  (this->targetsize_).rep_ = (Rep *)0x0;
  if (this != (ResizeBilinearLayerParams *)&_ResizeBilinearLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->mode_ = (SamplingMode *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

ResizeBilinearLayerParams::ResizeBilinearLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ResizeBilinearLayerParams)
}